

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O0

int anon_unknown.dwarf_aa9bcd::CoordinateArgPos(TString *name,bool isTexture)

{
  bool bVar1;
  bool isTexture_local;
  TString *name_local;
  
  if ((isTexture) && (bVar1 = std::operator==(name,"GetDimensions"), !bVar1)) {
    bVar1 = std::operator==(name,"Load");
    if (!bVar1) {
      return 2;
    }
    return 1;
  }
  return -1;
}

Assistant:

int CoordinateArgPos(const glslang::TString& name, bool isTexture)
{
    if (!isTexture || (name == "GetDimensions"))
        return -1;  // has none
    else if (name == "Load")
        return 1;
    else
        return 2;  // other texture methods are 2
}